

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_agree_mac(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *mac,
                 unsigned_long mac_len)

{
  LIBSSH2_MAC_METHOD *pLVar1;
  LIBSSH2_MAC_METHOD **methodlist;
  char *pcVar2;
  uchar *puVar3;
  LIBSSH2_COMMON_METHOD *pLVar4;
  uchar *puVar5;
  size_t sVar6;
  int unaff_R15D;
  
  methodlist = _libssh2_mac_methods();
  puVar5 = (uchar *)session->kex_prefs;
  if (puVar5 == (uchar *)0x0) {
    unaff_R15D = -1;
    pLVar1 = *methodlist;
    while (pLVar1 != (LIBSSH2_MAC_METHOD *)0x0) {
      methodlist = methodlist + 1;
      puVar5 = (uchar *)pLVar1->name;
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      sVar6 = strlen((char *)puVar5);
      puVar5 = kex_agree_instr((uchar *)endpoint,(unsigned_long)mac,puVar5,sVar6);
      if (puVar5 != (uchar *)0x0) {
        session->ssh_msg_debug =
             (_func_void_LIBSSH2_SESSION_ptr_int_char_ptr_int_char_ptr_int_void_ptr_ptr *)pLVar1;
        return 0;
      }
      pLVar1 = *methodlist;
    }
  }
  else {
    do {
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar5 == '\0') {
        return -1;
      }
      pcVar2 = strchr((char *)puVar5,0x2c);
      if (pcVar2 == (char *)0x0) {
        sVar6 = strlen((char *)puVar5);
      }
      else {
        sVar6 = (long)pcVar2 - (long)puVar5;
      }
      puVar3 = kex_agree_instr((uchar *)endpoint,(unsigned_long)mac,puVar5,sVar6);
      if (puVar3 == (uchar *)0x0) {
        puVar5 = (uchar *)(pcVar2 + 1);
        if (pcVar2 == (char *)0x0) {
          puVar5 = (uchar *)0x0;
        }
      }
      else {
        pLVar4 = kex_get_method_by_name((char *)puVar5,sVar6,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar4 == (LIBSSH2_COMMON_METHOD *)0x0) {
          unaff_R15D = -1;
        }
        else {
          session->ssh_msg_debug =
               (_func_void_LIBSSH2_SESSION_ptr_int_char_ptr_int_char_ptr_int_void_ptr_ptr *)pLVar4;
          unaff_R15D = 0;
        }
      }
    } while (puVar3 == (uchar *)0x0);
  }
  return unaff_R15D;
}

Assistant:

static int kex_agree_mac(LIBSSH2_SESSION * session,
                         libssh2_endpoint_data * endpoint, unsigned char *mac,
                         unsigned long mac_len)
{
    const LIBSSH2_MAC_METHOD **macp = _libssh2_mac_methods();
    unsigned char *s;
    (void) session;

    if (endpoint->mac_prefs) {
        s = (unsigned char *) endpoint->mac_prefs;

        while (s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if (kex_agree_instr(mac, mac_len, s, method_len)) {
                const LIBSSH2_MAC_METHOD *method = (const LIBSSH2_MAC_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           macp);

                if (!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->mac = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while (*macp && (*macp)->name) {
        s = kex_agree_instr(mac, mac_len, (unsigned char *) (*macp)->name,
                            strlen((*macp)->name));
        if (s) {
            endpoint->mac = *macp;
            return 0;
        }
        macp++;
    }

    return -1;
}